

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O3

bool __thiscall
nivalis::anon_unknown_3::Differentiator::diff
          (Differentiator *this,ASTNode **ast,uint32_t diff_arg_id)

{
  pointer *ppAVar1;
  uint32_t opcode;
  pointer ast_00;
  _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var2;
  bool bVar3;
  const_iterator cVar4;
  ASTNode *pAVar5;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *pvVar6;
  uint64_t uVar7;
  _OpCode _Var8;
  long lVar9;
  ASTNode *pAVar10;
  iterator iVar11;
  vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
  *this_00;
  size_type sVar12;
  pointer pUVar13;
  int64_t i;
  ulong uVar14;
  long lVar15;
  ASTNode **ast_01;
  long lVar16;
  uint64_t uVar17;
  undefined4 uVar18;
  uint uVar19;
  undefined4 uVar20;
  ASTNode *tmp;
  ASTNode *tmp_1;
  ASTNode *tmp1;
  __hashtable *__h;
  ASTNode *elnbptr;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_c8;
  uint32_t local_a4;
  ASTNode local_a0;
  pointer local_90;
  size_type local_88;
  uint64_t local_80;
  ASTNode *local_78;
  _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ASTNode *local_38;
  
  ast_01 = &this->ast_root;
  if (ast != (ASTNode **)0x0) {
    ast_01 = ast;
  }
  pAVar10 = *ast_01;
  opcode = pAVar10->opcode;
  pAVar5 = pAVar10 + 1;
  *ast_01 = pAVar5;
  local_a4 = diff_arg_id;
  if ((int)opcode < 0x4005) {
    if (0x3f < (int)opcode) {
      uVar14 = (ulong)(opcode - 0x41);
      if (opcode - 0x41 < 0x25) {
        if ((0x1f800e0000U >> (uVar14 & 0x3f) & 1) == 0) {
          if ((0x18000UL >> (uVar14 & 0x3f) & 1) != 0) {
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,bnz);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,(uint)(opcode == 0x50) * 3 + le);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            local_c8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start = *ast_01;
            copy_ast(this,local_c8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,this->out);
            skip_ast((ASTNode **)&local_c8);
            copy_ast(this,local_c8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,this->out);
            begin_thunk(this);
            bVar3 = diff(this,ast_01,local_a4);
            if (!bVar3) {
              return false;
            }
            end_thunk(this);
            begin_thunk(this);
            bVar3 = diff(this,ast_01,local_a4);
            if (!bVar3) {
              return false;
            }
            end_thunk(this);
            return true;
          }
          if (uVar14 == 0) {
            local_a0._0_8_ = pAVar5;
            skip_ast((ASTNode **)&local_a0);
            bVar3 = ast_has_var((ASTNode **)&local_a0,this->var_addr);
            if (bVar3) {
              return false;
            }
            pAVar5 = *ast_01;
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            bVar3 = diff(this,ast_01,local_a4);
            if (!bVar3) {
              return false;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,divi);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,logb);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            copy_ast(this,*ast_01,this->out);
            copy_ast(this,pAVar5,this->out);
            goto LAB_0012dca8;
          }
          goto LAB_0012dc5b;
        }
      }
      else {
LAB_0012dc5b:
        if (4 < opcode - 0x4000) {
          if (opcode != 0x40) {
            return true;
          }
          local_78 = pAVar5;
          skip_ast(&local_78);
          pAVar10 = local_78;
          bVar3 = ast_has_var(&local_78,this->var_addr);
          pAVar5 = *ast_01;
          if (bVar3) {
            local_c8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
            local_c8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
            local_c8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (ASTNode *)0x0;
            Expr::ASTNode::ASTNode(&local_a0,mul);
            if (local_c8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_c8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>
                        (&local_c8,
                         (iterator)
                         local_c8.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
            }
            else {
              (local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish)->opcode = local_a0.opcode;
              *(undefined4 *)
               &(local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_a0._4_4_;
              *(anon_union_8_3_343d95dd_for_ASTNode_1 *)
               ((long)local_c8.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) = local_a0.field_1;
              local_c8.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)local_c8.
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x10);
            }
            copy_ast(this,pAVar10,&local_c8);
            Expr::ASTNode::ASTNode(&local_a0,logb);
            if (local_c8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_c8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>
                        (&local_c8,
                         (iterator)
                         local_c8.
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
            }
            else {
              (local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish)->opcode = local_a0.opcode;
              *(undefined4 *)
               &(local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_a0._4_4_;
              *(anon_union_8_3_343d95dd_for_ASTNode_1 *)
               ((long)local_c8.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8) = local_a0.field_1;
              local_c8.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)local_c8.
                                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x10);
            }
            copy_ast(this,pAVar5,&local_c8);
            skip_ast(ast_01);
            skip_ast(ast_01);
            ast_00 = local_c8.
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_38 = local_c8.
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode(&local_a0,mul);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,&local_a0);
            }
            else {
              (iVar11._M_current)->opcode = local_a0.opcode;
              *(undefined4 *)&(iVar11._M_current)->field_0x4 = local_a0._4_4_;
              (iVar11._M_current)->field_1 = local_a0.field_1;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode(&local_a0,expb);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,&local_a0);
            }
            else {
              (iVar11._M_current)->opcode = local_a0.opcode;
              *(undefined4 *)&(iVar11._M_current)->field_0x4 = local_a0._4_4_;
              (iVar11._M_current)->field_1 = local_a0.field_1;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
            copy_ast(this,ast_00,this->out);
            bVar3 = diff(this,&local_38,local_a4);
            if (local_c8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
              operator_delete(local_c8.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_c8.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (!bVar3) {
              return false;
            }
            return true;
          }
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
          iVar11._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
          }
          else {
            *(pointer *)iVar11._M_current =
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar11._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          bVar3 = diff(this,ast_01,local_a4);
          if (!bVar3) {
            return false;
          }
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
          iVar11._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
          }
          else {
            *(pointer *)iVar11._M_current =
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar11._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          copy_ast(this,*ast_01,this->out);
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_c8,power);
          iVar11._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
          }
          else {
            *(pointer *)iVar11._M_current =
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar11._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          copy_ast(this,pAVar5,this->out);
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sub);
          iVar11._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
          }
          else {
            *(pointer *)iVar11._M_current =
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar11._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          copy_ast(this,*ast_01,this->out);
          pvVar6 = this->out;
          uVar19 = 0x3ff00000;
          goto LAB_0012d9d6;
        }
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,0.0);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      skip_ast(ast_01);
      goto LAB_0012dca8;
    }
    if (0x1f < (int)opcode) {
      if ((int)opcode < 0x31) {
        if (opcode - 0x20 < 2) {
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_c8,opcode,0xffffffffffffffff);
          iVar11._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
          }
          else {
            *(pointer *)iVar11._M_current =
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar11._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          bVar3 = diff(this,ast_01,local_a4);
          if (!bVar3) {
            return false;
          }
          goto LAB_0012f2bd;
        }
        if (opcode != 0x30) {
          return true;
        }
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_c8,add);
        iVar11._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
        }
        else {
          *(pointer *)iVar11._M_current =
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar11._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        pAVar5 = *ast_01;
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
        iVar11._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
        }
        else {
          *(pointer *)iVar11._M_current =
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar11._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        bVar3 = diff(this,ast_01,local_a4);
        if (!bVar3) {
          return false;
        }
        copy_ast(this,*ast_01,this->out);
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
        iVar11._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
        }
        else {
          *(pointer *)iVar11._M_current =
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar11._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        bVar3 = diff(this,ast_01,local_a4);
        if (!bVar3) {
          return false;
        }
        goto LAB_001302e9;
      }
      if (opcode != 0x31) {
        if (opcode != 0x32) {
          return true;
        }
        bVar3 = diff(this,ast_01,diff_arg_id);
        if (!bVar3) {
          return false;
        }
        bVar3 = ast_has_var(ast_01,this->var_addr);
        if (bVar3) {
          return false;
        }
        return true;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,divi);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sub);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pAVar10 = *ast_01;
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      bVar3 = diff(this,ast_01,local_a4);
      if (!bVar3) {
        return false;
      }
      pAVar5 = *ast_01;
      copy_ast(this,pAVar5,this->out);
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      bVar3 = diff(this,ast_01,local_a4);
      if (!bVar3) {
        return false;
      }
      copy_ast(this,pAVar10,this->out);
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sqrb);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pvVar6 = this->out;
      goto LAB_001302f6;
    }
    switch(opcode) {
    case 0:
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,null);
      goto LAB_0012fde9;
    case 1:
      pvVar6 = this->out;
      uVar19 = 0;
      break;
    case 2:
      pvVar6 = this->out;
      if ((pAVar10->field_1).ref == this->var_addr) {
        uVar19 = 0x3ff00000;
      }
      else {
        uVar19 = 0;
      }
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,(double)((ulong)uVar19 << 0x20));
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current !=
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
        return true;
      }
      goto LAB_0012fe0c;
    case 3:
      pvVar6 = this->out;
      if ((pAVar10->field_1).ref == (ulong)diff_arg_id) {
        uVar19 = 0x3ff00000;
      }
      else {
        uVar19 = 0;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0xf:
      goto LAB_001302fd;
    case 0xc:
      uVar19 = (pAVar10->field_1).call_info[0];
      pUVar13 = (this->env).funcs.
                super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar12 = pUVar13[uVar19].n_args;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            &pUVar13[uVar19].expr.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>;
      cVar4 = std::
              _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->vis_asts)._M_h,(key_type *)&local_c8);
      if (cVar4.super__Node_iterator_base<const_nivalis::Expr::ASTNode_*,_false>._M_cur !=
          (__node_type *)0x0) {
        return false;
      }
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90 = pUVar13;
      local_70 = &(this->vis_asts)._M_h;
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::resize((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                *)&local_c8,sVar12);
      local_88 = sVar12;
      if (sVar12 != 0) {
        pAVar5 = *ast_01;
        lVar16 = 0;
        do {
          pAVar5 = copy_ast(this,pAVar5,
                            (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             *)((long)&(local_c8.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar16)
                           );
          lVar16 = lVar16 + 0x18;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      std::
      vector<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>,std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>>
      ::
      emplace_back<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>
                ((vector<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>,std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>>
                  *)&this->argv,
                 (vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                  *)&local_c8);
      pUVar13 = local_90 + uVar19;
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::~vector((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                 *)&local_c8);
      sVar12 = local_88;
      if (local_88 != 0) {
        pvVar6 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&local_c8,add);
        iVar11._M_current =
             (pvVar6->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (pvVar6->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
        }
        else {
          *(pointer *)iVar11._M_current =
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (iVar11._M_current)->field_1 =
               (anon_union_8_3_343d95dd_for_ASTNode_1)
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          ppAVar1 = &(pvVar6->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      p_Var2 = local_70;
      local_a0._0_8_ =
           *(undefined8 *)
            &(pUVar13->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_70;
      local_78 = (ASTNode *)local_a0._0_8_;
      std::
      _Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<nivalis::Expr::ASTNode_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<nivalis::Expr::ASTNode_const*,false>>>>
                ((_Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_70);
      bVar3 = diff(this,(ASTNode **)&local_a0,0xffffffff);
      if (!bVar3) {
        return false;
      }
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            &(pUVar13->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl;
      local_90 = pUVar13;
      std::
      _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(p_Var2);
      if (sVar12 != 0) {
        local_68 = local_88 - 1;
        uVar14 = 0;
        do {
          if (uVar14 < local_68) {
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&local_c8,add);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
            }
            else {
              *(pointer *)iVar11._M_current =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (iVar11._M_current)->field_1 =
                   (anon_union_8_3_343d95dd_for_ASTNode_1)
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
            }
          }
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
          iVar11._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
          }
          else {
            *(pointer *)iVar11._M_current =
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (iVar11._M_current)->field_1 =
                 (anon_union_8_3_343d95dd_for_ASTNode_1)
                 local_c8.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          pUVar13 = local_90;
          bVar3 = diff(this,ast_01,local_a4);
          p_Var2 = local_70;
          if (!bVar3) {
            return false;
          }
          local_a0._0_8_ =
               *(undefined8 *)
                &(pUVar13->expr).ast.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl;
          local_c8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_70;
          local_80 = uVar14;
          local_78 = (ASTNode *)local_a0._0_8_;
          std::
          _Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<nivalis::Expr::ASTNode_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<nivalis::Expr::ASTNode_const*,false>>>>
                    ((_Hashtable<nivalis::Expr::ASTNode_const*,nivalis::Expr::ASTNode_const*,std::allocator<nivalis::Expr::ASTNode_const*>,std::__detail::_Identity,std::equal_to<nivalis::Expr::ASTNode_const*>,std::hash<nivalis::Expr::ASTNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_70,&local_78,&local_c8);
          uVar17 = local_80;
          bVar3 = diff(this,(ASTNode **)&local_a0,(uint32_t)local_80);
          if (!bVar3) {
            return false;
          }
          local_c8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                &(pUVar13->expr).ast.
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 ._M_impl;
          std::
          _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(p_Var2,&local_c8);
          uVar14 = uVar17 + 1;
        } while (local_88 != uVar14);
      }
      this_00 = (this->argv).
                super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->argv).
      super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = this_00;
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::~vector(this_00);
      return true;
    case 0x10:
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,bnz);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pAVar5 = copy_ast(this,*ast_01,this->out);
      *ast_01 = pAVar5;
      if (pAVar5->opcode != 8) {
        return false;
      }
      *ast_01 = pAVar5 + 1;
      begin_thunk(this);
      bVar3 = diff(this,ast_01,local_a4);
      if (!bVar3) {
        return false;
      }
      end_thunk(this);
      pAVar5 = *ast_01;
      if (pAVar5->opcode != 9) {
        return false;
      }
      *ast_01 = pAVar5 + 1;
      if (pAVar5[1].opcode != 8) {
        return false;
      }
      *ast_01 = pAVar5 + 2;
      begin_thunk(this);
      bVar3 = diff(this,ast_01,local_a4);
      if (!bVar3) {
        return false;
      }
      end_thunk(this);
      if ((*ast_01)->opcode != 9) {
        return false;
      }
      *ast_01 = *ast_01 + 1;
      return true;
    case 0x11:
      pUVar13 = (pointer)(pAVar10->field_1).ref;
      if (pUVar13 == (pointer)this->var_addr) {
        return false;
      }
      if (pAVar5->opcode != 1) {
        return false;
      }
      uVar17 = (uint64_t)pAVar10[1].field_1.val;
      *ast_01 = pAVar10 + 2;
      if (pAVar10[2].opcode != 1) {
        return false;
      }
      uVar7 = (uint64_t)pAVar10[2].field_1.val;
      *ast_01 = pAVar10 + 3;
      if (pAVar10[3].opcode != 8) {
        return false;
      }
      local_88 = (ulong)((long)uVar17 <= (long)uVar7) * 2 + -1;
      local_80 = (ulong)((long)uVar17 <= (long)uVar7) * 2 + -1 + uVar7;
      *ast_01 = pAVar10 + 4;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90 = pUVar13;
      do {
        if (local_80 == uVar17) {
          skip_ast(ast_01);
          goto LAB_00130317;
        }
        local_78 = *ast_01;
        if (uVar7 != uVar17) {
          pvVar6 = this->out;
          Expr::ASTNode::ASTNode(&local_a0,add);
          iVar11._M_current =
               (pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (pvVar6->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,&local_a0);
            pUVar13 = local_90;
          }
          else {
            (iVar11._M_current)->opcode = local_a0.opcode;
            *(undefined4 *)&(iVar11._M_current)->field_0x4 = local_a0._4_4_;
            (iVar11._M_current)->field_1 = local_a0.field_1;
            ppAVar1 = &(pvVar6->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
            pUVar13 = local_90;
          }
        }
        (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(long)pUVar13] = (double)(long)uVar17;
        if (local_c8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_c8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_c8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        ast_sub_var(&local_78,(uint64_t)pUVar13,(double)(long)uVar17,&local_c8);
        local_78 = local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = diff(this,&local_78,local_a4);
        uVar17 = uVar17 + local_88;
      } while (bVar3);
      goto LAB_00130505;
    case 0x12:
      local_80 = (pAVar10->field_1).ref;
      if (local_80 == this->var_addr) {
        return false;
      }
      if (pAVar5->opcode != 1) {
        return false;
      }
      lVar16 = (long)pAVar10[1].field_1.val;
      *ast_01 = pAVar10 + 2;
      if (pAVar10[2].opcode != 1) {
        return false;
      }
      lVar9 = (long)pAVar10[2].field_1.val;
      *ast_01 = pAVar10 + 3;
      local_88 = lVar16 - lVar9;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
      local_c8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pAVar10[3].opcode != 8) {
        return false;
      }
      lVar15 = (ulong)(local_88 == 0 || lVar16 < lVar9) * 2 + -1;
      *ast_01 = pAVar10 + 4;
      if (lVar9 + lVar15 != lVar16) {
        local_68 = local_88 - lVar15;
        local_90 = (pointer)0x0;
        local_58 = lVar15;
        local_50 = lVar9;
        local_40 = lVar16;
        do {
          local_60 = lVar16;
          if (lVar16 != local_50) {
            pvVar6 = this->out;
            Expr::ASTNode::ASTNode(&local_a0,add);
            iVar11._M_current =
                 (pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pvVar6->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,&local_a0);
              lVar15 = local_58;
            }
            else {
              (iVar11._M_current)->opcode = local_a0.opcode;
              *(undefined4 *)&(iVar11._M_current)->field_0x4 = local_a0._4_4_;
              (iVar11._M_current)->field_1 = local_a0.field_1;
              ppAVar1 = &(pvVar6->
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar1 = *ppAVar1 + 1;
              lVar15 = local_58;
            }
          }
          local_48 = local_60 + lVar15;
          local_70 = (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(double)local_60;
          uVar17 = 0;
          do {
            if (local_88 + uVar17 != 0) {
              pvVar6 = this->out;
              Expr::ASTNode::ASTNode(&local_a0,mul);
              iVar11._M_current =
                   (pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar11._M_current ==
                  (pvVar6->
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,&local_a0);
                lVar15 = local_58;
              }
              else {
                (iVar11._M_current)->opcode = local_a0.opcode;
                *(undefined4 *)&(iVar11._M_current)->field_0x4 = local_a0._4_4_;
                (iVar11._M_current)->field_1 = local_a0.field_1;
                ppAVar1 = &(pvVar6->
                           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppAVar1 = *ppAVar1 + 1;
                lVar15 = local_58;
              }
            }
            if (local_90 == (pointer)uVar17) {
              (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_80] = (double)local_70;
              if (local_c8.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_c8.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_c8.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_c8.
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
              local_a0._0_8_ = *ast_01;
              ast_sub_var((ASTNode **)&local_a0,local_80,(double)local_70,&local_c8);
              local_a0._0_8_ =
                   local_c8.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              bVar3 = diff(this,(ASTNode **)&local_a0,local_a4);
              if (!bVar3) goto LAB_00130505;
            }
            else {
              local_a0._0_8_ = *ast_01;
              ast_sub_var((ASTNode **)&local_a0,local_80,(double)(long)(local_40 + uVar17),this->out
                         );
            }
            uVar17 = uVar17 + lVar15;
          } while (local_68 + uVar17 != 0);
          local_90 = (pointer)((long)local_90 + lVar15);
          lVar16 = local_48;
        } while (local_60 != local_50);
      }
      skip_ast(ast_01);
LAB_00130317:
      if ((*ast_01)->opcode == 9) {
        *ast_01 = *ast_01 + 1;
        if (local_c8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start == (ASTNode *)0x0) {
          return true;
        }
        operator_delete(local_c8.
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        return true;
      }
LAB_00130505:
      if (local_c8.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start == (ASTNode *)0x0) {
        return false;
      }
      operator_delete(local_c8.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return false;
    default:
      if (opcode != 0x18) {
        return true;
      }
      skip_ast(ast_01);
      goto LAB_0012f2bd;
    }
    goto LAB_0012fde4;
  }
  switch(opcode) {
  case 0x8000:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,unaryminus);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    goto LAB_0012f2bd;
  case 0x8001:
  case 0x8005:
  case 0x8006:
  case 0x8007:
  case 0x8008:
  case 0x800e:
    pvVar6 = this->out;
    uVar19 = 0;
LAB_0012d9d6:
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,(double)((ulong)uVar19 << 0x20));
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
LAB_0012dca8:
    skip_ast(ast_01);
    return true;
  case 0x8002:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sgn;
    goto LAB_0012f281;
  case 0x8003:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,0.5);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,power);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    uVar19 = 0xbfe00000;
    goto LAB_0012fde4;
  case 0x8004:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = mul;
    goto LAB_0012f370;
  case 0x8009:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = expb;
    break;
  case 0x800a:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,0.6931471805599453);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = exp2b;
    break;
  case 0x800b:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,divi);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
LAB_001302ad:
    pvVar6 = this->out;
    uVar18 = 0;
    uVar20 = 0x3ff00000;
    goto LAB_001302bf;
  case 0x800c:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,divi);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    uVar18 = 0xbbb55516;
    uVar20 = 0x40026bb1;
    goto LAB_001302bf;
  case 0x800d:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,divi);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    uVar18 = 0xfefa39ef;
    uVar20 = 0x3fe62e42;
    goto LAB_001302bf;
  case 0x800f:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = cosb;
    break;
  case 0x8010:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,unaryminus);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sinb;
    break;
  case 0x8011:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,power);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,cosb);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    uVar19 = 0xc0000000;
LAB_0012fde4:
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,(double)((ulong)uVar19 << 0x20));
LAB_0012fde9:
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current !=
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
      return true;
    }
LAB_0012fe0c:
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    return true;
  case 0x8012:
  case 0x8013:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    if (opcode == 0x8013) {
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,unaryminus);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,divi);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sqrtb);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sub;
    goto LAB_0012fd28;
  case 0x8014:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,divi);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = add;
LAB_0012fd28:
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,_Var8);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
LAB_0012feaa:
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sqrb;
    break;
  case 0x8015:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = coshb;
    break;
  case 0x8016:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = sinhb;
    break;
  case 0x8017:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sub);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sqrb);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = tanhb;
    break;
  case 0x8018:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,tgammab);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    goto LAB_0012f7fd;
  case 0x8019:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
LAB_0012f7fd:
    pvVar6 = this->out;
    _Var8 = digammab;
    break;
  case 0x801a:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = trigammab;
    break;
  case 0x801b:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    _Var8 = polygammab;
LAB_0012f370:
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,_Var8);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    uVar18 = 0;
    uVar20 = 0x40000000;
LAB_001302bf:
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,(double)CONCAT44(uVar20,uVar18));
    goto LAB_001302c4;
  case 0x801c:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.1283791670955126);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,expb);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,unaryminus);
    goto LAB_0012feaa;
  case 0x801d:
    goto LAB_001302fd;
  case 0x801e:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sigmoidb);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,*ast_01,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sub);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,1.0);
    goto LAB_0012f1aa;
  case 0x801f:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
LAB_0012f1aa:
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    _Var8 = sigmoidb;
    goto LAB_0012f281;
  case 0x8020:
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,unaryminus);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,*ast_01,this->out);
    pvVar6 = this->out;
    _Var8 = gausspdfb;
LAB_0012f281:
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,_Var8);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pAVar10 = *ast_01;
    pvVar6 = this->out;
LAB_0012f2b8:
    copy_ast(this,pAVar10,pvVar6);
LAB_0012f2bd:
    bVar3 = diff(this,ast_01,local_a4);
    if (bVar3) {
      return true;
    }
LAB_001302fd:
    return false;
  default:
    if (opcode != 0x4005) {
      if (opcode != 0x4006) {
        return true;
      }
      local_a0._0_8_ = pAVar5;
      bVar3 = ast_has_var((ASTNode **)&local_a0,this->var_addr);
      if (bVar3) {
        return false;
      }
      pAVar10 = *ast_01;
      skip_ast(ast_01);
      pAVar5 = *ast_01;
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      bVar3 = diff(this,ast_01,local_a4);
      if (!bVar3) {
        return false;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,polygammab);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      pvVar6 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&local_c8,add);
      iVar11._M_current =
           (pvVar6->
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (pvVar6->
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
      }
      else {
        *(pointer *)iVar11._M_current =
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (iVar11._M_current)->field_1 =
             (anon_union_8_3_343d95dd_for_ASTNode_1)
             local_c8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        ppAVar1 = &(pvVar6->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      copy_ast(this,pAVar10,this->out);
      goto LAB_001302ad;
    }
    local_a0._0_8_ = pAVar5;
    skip_ast((ASTNode **)&local_a0);
    pAVar10 = (ASTNode *)local_a0._0_8_;
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,add);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,betab);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    copy_ast(this,pAVar10,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sub);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,digammab);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,digammab);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,add);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    copy_ast(this,pAVar10,this->out);
    bVar3 = diff(this,ast_01,local_a4);
    if (!bVar3) {
      return false;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,mul);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,betab);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    copy_ast(this,pAVar10,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,sub);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,digammab);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar10,this->out);
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,digammab);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    pvVar6 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&local_c8,add);
    iVar11._M_current =
         (pvVar6->
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
    }
    else {
      *(pointer *)iVar11._M_current =
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (iVar11._M_current)->field_1 =
           (anon_union_8_3_343d95dd_for_ASTNode_1)
           local_c8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ppAVar1 = &(pvVar6->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    copy_ast(this,pAVar5,this->out);
    pvVar6 = this->out;
    goto LAB_0012f2b8;
  }
  Expr::ASTNode::ASTNode((ASTNode *)&local_c8,_Var8);
LAB_001302c4:
  iVar11._M_current =
       (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (pvVar6->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    _M_realloc_insert<nivalis::Expr::ASTNode>(pvVar6,iVar11,(ASTNode *)&local_c8);
  }
  else {
    *(pointer *)iVar11._M_current =
         local_c8.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_start;
    (iVar11._M_current)->field_1 =
         (anon_union_8_3_343d95dd_for_ASTNode_1)
         local_c8.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_finish;
    ppAVar1 = &(pvVar6->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
LAB_001302e9:
  pvVar6 = this->out;
LAB_001302f6:
  copy_ast(this,pAVar5,pvVar6);
LAB_001302fd:
  return true;
}

Assistant:

bool diff(const Expr::ASTNode** ast = nullptr, uint32_t diff_arg_id = -1) {
        if (ast == nullptr) ast = &ast_root;
        using namespace OpCode;
        uint32_t opcode = (*ast)->opcode;
        // std::cout << opcode << " " << diff_arg_id << " " << out.size() << " :: ";
        // for (auto& i : out) { std::cout << i.opcode << " "; }
        // std::cout << "\n";
        ++*ast;
        switch(opcode) {
            case null: PUSH(null); break;
            case val: PUSH(0.); break;
            case ref: PUSH(((*ast)-1)->ref == var_addr ? 1. : 0.); break;
            case arg: PUSH(((*ast)-1)->ref == diff_arg_id ? 1. : 0.); break;
            case call:
                      {
                          uint32_t fid = ((*ast)-1)->call_info[0];
                          size_t n_args = env.funcs[fid].n_args;

                          const auto& fexpr = env.funcs[fid].expr;
                          if (vis_asts.count(&fexpr.ast[0])) {
                              // Prevent recursion/cycles
                              return false;
                          }
                          {
                              std::vector<Expr::AST> call_args;
                              call_args.resize(n_args);
                              const Expr::ASTNode* tmp = *ast;
                              for (size_t i = 0; i < n_args; ++i) {
                                  tmp = copy_ast(tmp, call_args[i]);
                              }
                              argv.push_back(std::move(call_args));
                          }
                          {
                              if (n_args > 0) out.push_back(add);
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr)) {
                                  return false;
                              }
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          for (size_t i = 0; i < n_args; ++i) {
                              if (i < n_args - 1) out.push_back(add);
                              out.push_back(mul);
                              DIFF_NEXT;
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr, (uint32_t)i)) return false;
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          argv.pop_back();
                      }
                      break;
            case bnz:
                      {
                          PUSH(bnz);
                          *ast = copy_ast(*ast, out);
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case sums:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          Expr::AST diff_tmp;
                          for (int64_t i = a; i != b; i += step) {
                              const Expr::ASTNode* tmp = *ast;
                              if (i + step != b) PUSH(OpCode::add);
                              env.vars[var_id] = static_cast<double>(i);
                              diff_tmp.clear();
                              ast_sub_var(&tmp, var_id, static_cast<double>(i), diff_tmp);
                              tmp = &diff_tmp[0];
                              if (!diff(&tmp, diff_arg_id)) return false;
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case prods:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          Expr::AST diff_tmp;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          for (int64_t i = a; i != b; i += step) {
                              if (i + step != b) PUSH(OpCode::add);
                              for (int64_t j = a; j != b; j += step) {
                                  if (j + step != b) PUSH(OpCode::mul);
                                  if (j == i) {
                                      env.vars[var_id] = static_cast<double>(i);
                                      diff_tmp.clear();
                                      const Expr::ASTNode* tmp = *ast;
                                      ast_sub_var(&tmp, var_id, static_cast<double>(j), diff_tmp);
                                      tmp = &diff_tmp[0];
                                      if (!diff(&tmp, diff_arg_id)) return false;
                                  } else {
                                      const Expr::ASTNode* tmp2 = *ast;
                                      ast_sub_var(&tmp2, var_id, static_cast<double>(j), out);
                                  }
                              }
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;

            case bsel: skip_ast(ast); DIFF_NEXT; break;
            case add: case sub: PUSH(opcode); DIFF_NEXT; DIFF_NEXT; break;
            case mul: {
                          // Product rule
                          PUSH(add);
                          const Expr::ASTNode* tmp1 = *ast;
                          PUSH(mul); DIFF_NEXT; // df *
                          copy_ast(*ast, out); // g
                          PUSH(mul);
                          DIFF_NEXT;
                          copy_ast(tmp1, out); // + dg * f
                      }
                break;
            case divi: {
                          // Quotient rule
                          PUSH(divi); PUSH(sub);
                          const Expr::ASTNode* tmp1 = *ast, *tmp1b = *ast;
                          PUSH(mul); DIFF_NEXT;  // df *
                          const Expr::ASTNode* tmp2 = *ast;
                          copy_ast(tmp2, out);  // g
                          PUSH(mul); DIFF_NEXT; copy_ast(tmp1, out); // - dg * f
                          tmp1 = tmp1b;
                          PUSH(sqrb); copy_ast(tmp2, out); // / g^2
                      }
                      break;
            case mod:
                      DIFF_NEXT;
                      // Cannot take derivative wrt modulus
                      if (ast_has_var(ast, var_addr)) return false;
                      break;

            case power:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          skip_ast(&tmp1);
                          const Expr::ASTNode* expon_pos = tmp1;
                          bool expo_nonconst = ast_has_var(&tmp1, var_addr);
                          if (expo_nonconst) {
                              const Expr::ASTNode* base_pos = *ast;
                              Expr::AST elnb;
                              elnb.push_back(mul);
                              copy_ast(expon_pos, elnb);
                              elnb.push_back(logb);
                              copy_ast(base_pos, elnb);
                              skip_ast(ast); skip_ast(ast);
                              const Expr::ASTNode* elnbptr = &elnb[0];
                              PUSH(mul); PUSH(expb);
                              copy_ast(elnbptr, out);
                              if (!diff(&elnbptr, diff_arg_id)) return false;
                          } else {
                              CHAIN_RULE(PUSH(mul);
                                      copy_ast(*ast, out);
                                      PUSH(power), // g(x) goes here
                                      PUSH(sub); copy_ast(*ast, out); PUSH(1.));
                              skip_ast(ast);
                          }
                      }
                      break;
            case logbase:
                      {
                          const Expr::ASTNode* tmp = *ast;
                          skip_ast(&tmp);
                          bool base_nonconst = ast_has_var(&tmp, var_addr);
                          // Cannot take derivative wrt base
                          if (base_nonconst) return false;
                          CHAIN_RULE(PUSH(divi);
                                  PUSH(1.0);PUSH(mul);
                                  PUSH(logb);
                                  copy_ast(*ast, out),);
                          skip_ast(ast);
                      }
                      break;
            case max: case min:
                      {
                          PUSH(bnz); PUSH(opcode == max ? ge : le);
                          const Expr::ASTNode* tmp = *ast;
                          copy_ast(tmp, out);
                          skip_ast(&tmp); copy_ast(tmp, out);
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          break;
                      }
            case land: case lor: case lxor: case gcd: case lcm: case choose: case fafact: case rifact:
            case lt: case le: case eq: case ne: case ge: case gt:
                      PUSH(0.0); skip_ast(ast); skip_ast(ast); // Integer functions: 0 derivative
                      break;
            case betab:
                      {
                          const Expr::ASTNode* tmp = *ast, *x_pos = *ast;
                          skip_ast(&tmp);
                          const Expr::ASTNode* y_pos = tmp;
                          PUSH(add);
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(x_pos,out);
                          PUSH(digammab); PUSH(add);
                          copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(y_pos,out);
                          PUSH(digammab); PUSH(add); copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                      }
                      break;
            case polygammab:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          bool idx_nonconst = ast_has_var(&tmp1, var_addr);
                          if (idx_nonconst) return false; // Can't differentiate wrt polygamma index
                          tmp1 = *ast;
                          skip_ast(ast);
                          CHAIN_RULE(PUSH(polygammab);
                                  PUSH(add);
                                  copy_ast(tmp1, out);
                                  PUSH(1.),);
                      }
                      break;
            case unaryminus: PUSH(unaryminus); DIFF_NEXT; break;
            case absb: {
                           PUSH(mul); PUSH(sgn);
                           copy_ast(*ast, out);
                           DIFF_NEXT;
                       }
                             break;
            case sqrtb: CHAIN_RULE(
                                PUSH(mul);
                                PUSH(0.5);
                                PUSH(power), // g(x) goes here
                                PUSH(-0.5)); break;
            case sqrb: CHAIN_RULE(PUSH(mul); PUSH(2.),); break;
            case lnot: case sgn: case floorb: case ceilb: case roundb: case factb:
                       PUSH(0.0); skip_ast(ast); break; // Integer functions; 0 derivative
            case expb: CHAIN_RULE(PUSH(expb),); break;
            case exp2b: CHAIN_RULE( PUSH(mul); PUSH(log(2.)); PUSH(exp2b),); break;
            case logb:  CHAIN_RULE(PUSH(divi);PUSH(1.0),); break;
            case log2b:  CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(2));,); break;
            case log10b: CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(10));,); break;
            case sinb:  CHAIN_RULE(PUSH(cosb),); break;
            case cosb:  CHAIN_RULE(PUSH(unaryminus); PUSH(sinb),); break;
            case tanb:  CHAIN_RULE(PUSH(power); PUSH(cosb);
                                ,PUSH(-2.)); break;
            case asinb: case acosb:
                        CHAIN_RULE(if (opcode == acosb) PUSH(unaryminus);
                                PUSH(divi); PUSH(1.);
                                PUSH(sqrtb); PUSH(sub); PUSH(1.); PUSH(sqrb),); break;
            case atanb:  CHAIN_RULE(PUSH(divi); PUSH(1.); PUSH(add); PUSH(1.); PUSH(sqrb),); break;
            case sinhb: CHAIN_RULE(PUSH(coshb),); break;
            case coshb: CHAIN_RULE(PUSH(sinhb),); break;
            case tanhb: CHAIN_RULE(PUSH(sub); PUSH(1.); PUSH(sqrb); PUSH(tanhb),); break;
            case tgammab:
                        {
                            const Expr::ASTNode* tmp = *ast;
                            out.push_back(mul); DIFF_NEXT;
                            PUSH(mul); PUSH(tgammab); copy_ast(tmp, out);
                            PUSH(digammab); copy_ast(tmp, out);
                        }
                        break;
            case digammab: CHAIN_RULE(PUSH(trigammab),); break;
            case trigammab: CHAIN_RULE(PUSH(polygammab); PUSH(2.),); break;
            case lgammab: CHAIN_RULE(PUSH(digammab),); break;
            case erfb:   CHAIN_RULE(
                                 PUSH(mul); PUSH(2.0 / sqrt(M_PI));
                                 PUSH(expb); PUSH(unaryminus); PUSH(sqrb),);
                         break;
            case sigmoidb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            PUSH(sub);
                            PUSH(1.);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                        ; 
                        break;
            case softplusb: 
                         {
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case gausspdfb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(unaryminus);
                            copy_ast(*ast, out);
                            PUSH(gausspdfb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case zetab:  return false; // Derivative not available
        }
        return true;
    }